

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_count_shift.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,lcg64_count_shift *R)

{
  delim_c dVar1;
  delim_c dVar2;
  bool bVar3;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var4;
  basic_istream<char,_std::char_traits<char>_> *this;
  delim_str P;
  result_type *in_RSI;
  basic_istream<char,_std::char_traits<char>_> *in_RDI;
  fmtflags flags;
  status_type S_new;
  parameter_type P_new;
  basic_istream<char,_std::char_traits<char>_> *in_00;
  delim_str *in_stack_ffffffffffffff98;
  basic_istream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  status_type *in_stack_ffffffffffffffa8;
  undefined5 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb5;
  undefined1 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc2;
  status_type local_38;
  parameter_type local_28;
  result_type *local_10;
  basic_istream<char,_std::char_traits<char>_> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  lcg64_count_shift::parameter_type::parameter_type(&local_28);
  lcg64_count_shift::status_type::status_type(&local_38);
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  this = local_8 + *(long *)(*(long *)local_8 + -0x18);
  _Var4 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var4 = Catch::clara::std::operator|(_Var4,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)this,_Var4);
  in_00 = local_8;
  utility::ignore_spaces();
  utility::operator>>(in_00,(ignore_spaces_cl *)this);
  dVar1 = utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  lcg64_count_shift::name();
  P = utility::delim((char *)this);
  utility::operator>>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  dVar2 = utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  operator>>((basic_istream<char,_std::char_traits<char>_> *)
             CONCAT44(__fmtfl,CONCAT22(in_stack_ffffffffffffffc2,
                                       CONCAT11(dVar1.c,in_stack_ffffffffffffffc0))),
             (parameter_type *)P.str);
  dVar1 = utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  operator>>((basic_istream<char,_std::char_traits<char>_> *)
             CONCAT17(dVar2.c,CONCAT16(dVar1.c,CONCAT15(in_stack_ffffffffffffffb5,
                                                        in_stack_ffffffffffffffb0))),
             in_stack_ffffffffffffffa8);
  utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  bVar3 = std::ios::operator_cast_to_bool((ios *)(local_8 + *(long *)(*(long *)local_8 + -0x18)));
  if (bVar3) {
    *local_10 = local_28.a;
    local_10[1] = local_28.b;
    local_10[2] = local_28.inc;
    local_10[3] = local_38.r;
    local_10[4] = local_38.count;
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(local_8 + *(long *)(*(long *)local_8 + -0x18)),__fmtfl);
  return local_8;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, lcg64_count_shift &R) {
      lcg64_count_shift::parameter_type P_new;
      lcg64_count_shift::status_type S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::ignore_spaces();
      in >> utility::delim('[') >> utility::delim(lcg64_count_shift::name()) >>
          utility::delim(' ') >> P_new >> utility::delim(' ') >> S_new >> utility::delim(']');
      if (in) {
        R.P = P_new;
        R.S = S_new;
      }
      in.flags(flags);
      return in;
    }